

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visitor_tmpl_impl.hpp
# Opt level: O2

void __thiscall
hiberlite::AVisitor<hiberlite::KillChildren>::divePrefix
          (AVisitor<hiberlite::KillChildren> *this,string *name)

{
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)name);
  pushAndSubPrefix(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void AVisitor<Vis>::divePrefix(std::string name){
	pushAndSubPrefix(name);
}